

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_race(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  int iVar2;
  JSValue v;
  JSValue obj;
  JSValue obj_00;
  JSValue method;
  JSValue JVar3;
  JSValue v_00;
  undefined8 in_stack_ffffffffffffff28;
  uint uVar4;
  JSValue *argv_00;
  BOOL *in_stack_ffffffffffffff30;
  BOOL done;
  JSValue local_88;
  JSValue resolving_funcs [2];
  JSValue error;
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if ((int)this_val.tag == -1) {
    v = js_new_promise_capability(ctx,resolving_funcs,this_val);
    v.u = v.u;
    if ((int)v.tag != 6) {
      obj = JS_GetPropertyInternal(ctx,this_val,0x80,this_val,0);
      if ((int)obj.tag == 6) {
        obj_00 = (JSValue)(ZEXT816(3) << 0x40);
        method = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        iVar2 = check_function(ctx,obj);
        if (iVar2 == 0) {
          obj_00 = JS_GetIterator(ctx,*argv,0);
          if ((int)obj_00.tag == 6) {
            method = (JSValue)(ZEXT816(3) << 0x40);
          }
          else {
            argv_00 = (JSValue *)((ulong)uVar4 << 0x20);
            method = JS_GetPropertyInternal(ctx,obj_00,0x6a,obj_00,0);
            if ((int)method.tag != 6) {
              do {
                local_88 = JS_IteratorNext(ctx,obj_00,method,(int)&done,argv_00,
                                           in_stack_ffffffffffffff30);
                if ((int)local_88.tag == 6) goto LAB_0013dda7;
                if (done != 0) goto LAB_0013de41;
                argv_00 = &local_88;
                JVar3 = JS_Call(ctx,obj,this_val,1,argv_00);
                JS_FreeValue(ctx,local_88);
                if ((int)JVar3.tag == 6) break;
                JVar3 = JS_InvokeFree(ctx,JVar3,0x7f,2,resolving_funcs);
                iVar2 = check_exception_free(ctx,JVar3);
              } while (iVar2 == 0);
              JS_IteratorClose(ctx,obj_00,1);
            }
          }
        }
        else {
          obj_00 = (JSValue)(ZEXT816(3) << 0x40);
          method = (JSValue)(ZEXT816(3) << 0x40);
        }
      }
LAB_0013dda7:
      pJVar1 = ctx->rt;
      error.u = (pJVar1->current_exception).u;
      error.tag = (pJVar1->current_exception).tag;
      (pJVar1->current_exception).u.int32 = 0;
      (pJVar1->current_exception).tag = 2;
      v_00 = JS_Call(ctx,resolving_funcs[1],(JSValue)(ZEXT816(3) << 0x40),1,&error);
      JVar3.tag = error.tag;
      JVar3.u.float64 = error.u.float64;
      JS_FreeValue(ctx,JVar3);
      if ((int)v_00.tag == 6) {
        JS_FreeValue(ctx,v);
        v = (JSValue)(ZEXT816(6) << 0x40);
      }
      else {
        JS_FreeValue(ctx,v_00);
      }
LAB_0013de41:
      JS_FreeValue(ctx,obj);
      JS_FreeValue(ctx,method);
      JS_FreeValue(ctx,obj_00);
      JS_FreeValue(ctx,resolving_funcs[0]);
      JS_FreeValue(ctx,resolving_funcs[1]);
      v.tag = v.tag;
      v.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | (ulong)v.u.ptr & 0xffffffff00000000);
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  return v;
}

Assistant:

static JSValue js_promise_race(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue result_promise, resolving_funcs[2], item, next_promise, ret;
    JSValue next_method = JS_UNDEFINED, iter = JS_UNDEFINED;
    JSValue promise_resolve = JS_UNDEFINED;
    BOOL done;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    promise_resolve = JS_GetProperty(ctx, this_val, JS_ATOM_resolve);
    if (JS_IsException(promise_resolve) ||
        check_function(ctx, promise_resolve))
        goto fail_reject;
    iter = JS_GetIterator(ctx, argv[0], FALSE);
    if (JS_IsException(iter)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED, 1,
                       (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret))
            goto fail;
        JS_FreeValue(ctx, ret);
    } else {
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail_reject;

        for(;;) {
            /* XXX: conformance: should close the iterator if error on 'done'
               access, but not on 'value' access */
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail_reject;
            if (done)
                break;
            next_promise = JS_Call(ctx, promise_resolve,
                                   this_val, 1, (JSValueConst *)&item);
            JS_FreeValue(ctx, item);
            if (JS_IsException(next_promise)) {
            fail_reject1:
                JS_IteratorClose(ctx, iter, TRUE);
                goto fail_reject;
            }
            ret = JS_InvokeFree(ctx, next_promise, JS_ATOM_then, 2,
                                (JSValueConst *)resolving_funcs);
            if (check_exception_free(ctx, ret))
                goto fail_reject1;
        }
    }
 done:
    JS_FreeValue(ctx, promise_resolve);
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    return result_promise;
 fail:
    //JS_FreeValue(ctx, next_method); // why not???
    JS_FreeValue(ctx, result_promise);
    result_promise = JS_EXCEPTION;
    goto done;
}